

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O1

void finish(mf *o)

{
  uchar *__ptr;
  float *__ptr_00;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&o->all->pairs,&o->pairs);
  __ptr = (o->indices)._begin;
  if (__ptr != (uchar *)0x0) {
    free(__ptr);
  }
  (o->indices)._begin = (uchar *)0x0;
  (o->indices)._end = (uchar *)0x0;
  (o->indices).end_array = (uchar *)0x0;
  __ptr_00 = (o->sub_predictions)._begin;
  if (__ptr_00 != (float *)0x0) {
    free(__ptr_00);
  }
  (o->sub_predictions)._begin = (float *)0x0;
  (o->sub_predictions)._end = (float *)0x0;
  (o->sub_predictions).end_array = (float *)0x0;
  return;
}

Assistant:

void finish(mf& o)
{
  // restore global pairs
  o.all->pairs = o.pairs;

  // clean up local v_arrays
  o.indices.delete_v();
  o.sub_predictions.delete_v();
}